

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_suppression.c
# Opt level: O2

int WebRtcNs_set_policy_core(NoiseSuppressionC *self,int mode)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  
  if ((uint)mode < 4) {
    uVar3 = (ulong)(uint)mode;
    fVar1 = *(float *)(&DAT_00113a50 + uVar3 * 4);
    iVar2 = *(int *)(&DAT_00113a60 + uVar3 * 4);
    self->overdrive = *(float *)(&DAT_00113a40 + uVar3 * 4);
    self->denoiseBound = fVar1;
    self->gainmap = iVar2;
    self->aggrMode = mode;
    return 0;
  }
  return -1;
}

Assistant:

int WebRtcNs_set_policy_core(NoiseSuppressionC *self, int mode) {
    // Allow for modes: 0, 1, 2, 3.
    if (mode == 0) {
        self->overdrive = 1.f;
        self->denoiseBound = 0.5f;
        self->gainmap = 0;
    } else if (mode == 1) {
        // self->overdrive = 1.25f;
        self->overdrive = 1.f;
        self->denoiseBound = 0.25f;
        self->gainmap = 1;
    } else if (mode == 2) {
        // self->overdrive = 1.25f;
        self->overdrive = 1.1f;
        self->denoiseBound = 0.125f;
        self->gainmap = 1;
    } else if (mode == 3) {
        // self->overdrive = 1.3f;
        self->overdrive = 1.25f;
        self->denoiseBound = 0.09f;
        self->gainmap = 1;
    } else {
        return -1;
    }
    self->aggrMode = mode;
    return 0;
}